

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

void Cnf_DataCollectFlipLits(Cnf_Dat_t *p,int iFlipVar,Vec_Int_t *vFlips)

{
  int iVar1;
  long lVar2;
  
  if (p->pMan == (Aig_Man_t *)0x0) {
    vFlips->nSize = 0;
    for (lVar2 = 0; lVar2 < p->nLiterals; lVar2 = lVar2 + 1) {
      iVar1 = Abc_Lit2Var((*p->pClauses)[lVar2]);
      if (iVar1 == iFlipVar) {
        Vec_IntPush(vFlips,(int)lVar2);
      }
    }
    return;
  }
  __assert_fail("p->pMan == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfMan.c"
                ,0xdd,"void Cnf_DataCollectFlipLits(Cnf_Dat_t *, int, Vec_Int_t *)");
}

Assistant:

void Cnf_DataCollectFlipLits( Cnf_Dat_t * p, int iFlipVar, Vec_Int_t * vFlips )
{
    int v;
    assert( p->pMan == NULL );
    Vec_IntClear( vFlips );
    for ( v = 0; v < p->nLiterals; v++ )
        if ( Abc_Lit2Var(p->pClauses[0][v]) == iFlipVar )
            Vec_IntPush( vFlips, v );
}